

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

lu_mem propagatemark(global_State *g)

{
  ushort uVar1;
  lua_State *L;
  CallInfo *pCVar2;
  lua_CFunction p_Var3;
  bool bVar4;
  lua_Alloc *pp_Var5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  GCObject **ppGVar10;
  TValue *pTVar11;
  ulong uVar12;
  lu_mem lVar13;
  StkId pSVar14;
  StkId pSVar15;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  int iVar19;
  GCObject *pGVar20;
  ulong uVar21;
  long lVar22;
  global_State *pgVar23;
  long lVar24;
  StkIdRel *pSVar25;
  UpVal *o;
  global_State *pgVar26;
  bool bVar27;
  
  L = (lua_State *)g->gray;
  bVar7 = L->marked;
  L->marked = bVar7 | 0x20;
  ppGVar10 = getgclist((GCObject *)L);
  g->gray = *ppGVar10;
  lVar13 = 0;
  switch(L->tt) {
  case '\x05':
    pSVar15 = (L->stack_last).p;
    if (pSVar15 == (StkId)0x0) {
LAB_0010d752:
      bVar7 = L->allowhook;
      pgVar26 = L->l_G;
      uVar9 = luaH_realasize((Table *)L);
      if (uVar9 != 0) {
        lVar22 = 0;
        do {
          if (((*(byte *)((long)(L->top).p + lVar22 + 8) & 0x40) != 0) &&
             (pGVar20 = *(GCObject **)((long)(L->top).p + lVar22), (pGVar20->marked & 0x18) != 0)) {
            reallymarkobject(g,pGVar20);
          }
          lVar22 = lVar22 + 0x10;
        } while ((ulong)uVar9 << 4 != lVar22);
      }
      for (pgVar23 = L->l_G;
          pgVar23 < (global_State *)(&pgVar26->frealloc + (long)(1 << (bVar7 & 0x1f)) * 3);
          pgVar23 = (global_State *)&pgVar23->GCdebt) {
        bVar6 = *(byte *)&pgVar23->ud;
        if ((bVar6 & 0xf) == 0) {
          if (((ulong)pgVar23->ud & 0x4000) != 0) {
            *(undefined1 *)((long)&pgVar23->ud + 1) = 0xb;
          }
        }
        else {
          if ((((ulong)pgVar23->ud & 0x4000) != 0) &&
             ((((GCObject *)pgVar23->totalbytes)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar23->totalbytes);
            bVar6 = *(byte *)&pgVar23->ud;
          }
          if (((bVar6 & 0x40) != 0) && ((((GCObject *)pgVar23->frealloc)->marked & 0x18) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar23->frealloc);
          }
        }
      }
      genlink(g,(GCObject *)L);
    }
    else {
      if (((pSVar15->tbclist).delta & 8) == 0) {
        pTVar11 = luaT_gettm((Table *)&pSVar15->val,TM_MODE,g->tmname[3]);
        pSVar15 = (L->stack_last).p;
        if (pSVar15 != (StkId)0x0) goto LAB_0010d6e3;
      }
      else {
        pTVar11 = (TValue *)0x0;
LAB_0010d6e3:
        if ((undefined1  [16])((undefined1  [16])*pSVar15 & (undefined1  [16])0x1800) !=
            (undefined1  [16])0x0) {
          reallymarkobject(g,(GCObject *)&pSVar15->val);
        }
      }
      if ((pTVar11 == (TValue *)0x0) || (pTVar11->tt_ != 'D')) goto LAB_0010d752;
      p_Var3 = (pTVar11->value_).f;
      pcVar16 = strchr((char *)(p_Var3 + 0x18),0x6b);
      pcVar17 = strchr((char *)(p_Var3 + 0x18),0x76);
      if (pcVar16 == (char *)0x0 && pcVar17 == (char *)0x0) goto LAB_0010d752;
      if (pcVar16 == (char *)0x0) {
        bVar7 = L->allowhook;
        bVar27 = *(int *)&L->nci != 0;
        if (bVar7 != 0x1f) {
          pgVar26 = L->l_G;
          pp_Var5 = &pgVar26->frealloc;
          bVar27 = *(int *)&L->nci != 0;
          do {
            bVar4 = ((ulong)pgVar26->ud & 0x4000) != 0;
            if (((ulong)pgVar26->ud & 0xf) == 0) {
              if (bVar4) {
                *(undefined1 *)((long)&pgVar26->ud + 1) = 0xb;
              }
            }
            else {
              if ((bVar4) && ((((GCObject *)pgVar26->totalbytes)->marked & 0x18) != 0)) {
                reallymarkobject(g,(GCObject *)pgVar26->totalbytes);
              }
              bVar4 = !bVar27;
              bVar27 = true;
              if (bVar4) {
                if (((ulong)pgVar26->ud & 0x40) == 0) {
                  pGVar20 = (GCObject *)0x0;
                }
                else {
                  pGVar20 = (GCObject *)pgVar26->frealloc;
                }
                iVar19 = iscleared(g,pGVar20);
                bVar27 = iVar19 != 0;
              }
            }
            pgVar26 = (global_State *)&pgVar26->GCdebt;
          } while (pgVar26 < pp_Var5 + (long)(1 << (bVar7 & 0x1f)) * 3);
        }
        bVar7 = g->gcstate == '\x02' & bVar27;
        L->stack = *(StkIdRel *)(&g->grayagain + bVar7);
        (&g->grayagain)[bVar7] = (GCObject *)L;
LAB_0010d979:
        L->marked = L->marked & 199;
      }
      else {
        if (pcVar17 != (char *)0x0) {
          L->stack = (StkIdRel)g->allweak;
          g->allweak = (GCObject *)L;
          goto LAB_0010d979;
        }
        traverseephemeron(g,(Table *)L,0);
      }
    }
    if (L->ci == (CallInfo *)0x0) {
      iVar19 = 0;
    }
    else {
      iVar19 = 2 << (L->allowhook & 0x1f);
    }
    lVar13 = (lu_mem)(*(int *)&L->nci + iVar19 + 1);
    break;
  case '\x06':
    pgVar26 = L->l_G;
    if ((pgVar26 != (global_State *)0x0) && (((ulong)pgVar26->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar26);
    }
    bVar7 = L->status;
    if (bVar7 == 0) goto LAB_0010d67c;
    uVar21 = 0;
    do {
      pCVar2 = (&L->ci)[uVar21];
      if ((pCVar2 != (CallInfo *)0x0) && (((pCVar2->top).offset & 0x1800U) != 0)) {
        reallymarkobject(g,(GCObject *)pCVar2);
        bVar7 = L->status;
      }
      uVar21 = uVar21 + 1;
      uVar12 = (ulong)bVar7;
    } while (uVar21 < uVar12);
    goto LAB_0010d617;
  case '\a':
    pgVar26 = L->l_G;
    if ((pgVar26 != (global_State *)0x0) && (((ulong)pgVar26->ud & 0x1800) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar26);
    }
    uVar8._0_1_ = L->status;
    uVar8._1_1_ = L->allowhook;
    if (uVar8 != 0) {
      pSVar25 = &L->stack;
      uVar21 = 0;
      do {
        if ((((ulong)*pSVar25 & 0x40) != 0) &&
           ((undefined1  [16])((undefined1  [16])*pSVar25[-1].p & (undefined1  [16])0x1800) !=
            (undefined1  [16])0x0)) {
          reallymarkobject(g,(GCObject *)&(pSVar25[-1].p)->val);
          uVar8._0_1_ = L->status;
          uVar8._1_1_ = L->allowhook;
        }
        uVar21 = uVar21 + 1;
        pSVar25 = pSVar25 + 2;
      } while (uVar21 < uVar8);
    }
    genlink(g,(GCObject *)L);
    uVar1._0_1_ = L->status;
    uVar1._1_1_ = L->allowhook;
    uVar12 = (ulong)uVar1;
    goto LAB_0010d617;
  case '\b':
    pSVar15 = (L->stack).p;
    if (((bVar7 & 6) != 0) || (g->gcstate == '\0')) {
      L->gclist = g->grayagain;
      g->grayagain = (GCObject *)L;
      L->marked = bVar7 & 199;
    }
    if (pSVar15 != (StkId)0x0) {
      pSVar14 = (L->top).p;
      for (; pSVar15 < pSVar14; pSVar15 = pSVar15 + 1) {
        if ((((pSVar15->val).tt_ & 0x40) != 0) && (((*(GCObject **)pSVar15)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pSVar15);
          pSVar14 = (L->top).p;
        }
      }
      for (o = L->openupval; o != (UpVal *)0x0; o = (o->u).open.next) {
        if ((o->marked & 0x18) != 0) {
          reallymarkobject(g,(GCObject *)o);
        }
      }
      if (g->gcstate == '\x02') {
        if (g->gcemergency == '\0') {
          luaD_shrinkstack(L);
        }
        for (pSVar15 = (L->top).p; pSVar15 < (StkId)((L->stack_last).offset + 0x50);
            pSVar15 = pSVar15 + 1) {
          (pSVar15->val).tt_ = '\0';
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      return ((long)(L->stack_last).p - (L->stack).offset) * 0x10000000 + 0x100000000 >> 0x20;
    }
LAB_0010d67c:
    lVar13 = 1;
    break;
  case '\t':
    break;
  case '\n':
    pCVar2 = (L->base_ci).previous;
    if ((pCVar2 != (CallInfo *)0x0) && (((pCVar2->top).offset & 0x1800U) != 0)) {
      reallymarkobject(g,(GCObject *)pCVar2);
    }
    iVar19 = *(int *)((long)&L->top + 4);
    if (0 < iVar19) {
      lVar24 = 8;
      lVar22 = 0;
      do {
        if (((*(byte *)((long)&L->openupval->next + lVar24) & 0x40) != 0) &&
           (pGVar20 = *(GCObject **)((long)L->openupval + lVar24 + -8),
           (pGVar20->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar20);
          iVar19 = *(int *)((long)&L->top + 4);
        }
        lVar22 = lVar22 + 1;
        lVar24 = lVar24 + 0x10;
      } while (lVar22 < iVar19);
    }
    iVar19 = *(int *)&L->top;
    if (0 < iVar19) {
      lVar24 = 0;
      lVar22 = 0;
      do {
        pGVar20 = *(GCObject **)((long)&L->twups->next + lVar24);
        if ((pGVar20 != (GCObject *)0x0) && ((pGVar20->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar20);
          iVar19 = *(int *)&L->top;
        }
        lVar22 = lVar22 + 1;
        lVar24 = lVar24 + 0x10;
      } while (lVar22 < iVar19);
    }
    iVar19 = *(int *)&L->ci;
    if (0 < iVar19) {
      lVar22 = 0;
      do {
        pGVar20 = (&L->gclist->next)[lVar22];
        if ((pGVar20 != (GCObject *)0x0) && ((pGVar20->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar20);
          iVar19 = *(int *)&L->ci;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar19);
    }
    iVar18 = *(int *)((long)&L->ci + 4);
    if (0 < iVar18) {
      lVar24 = 0;
      lVar22 = 0;
      do {
        pGVar20 = *(GCObject **)((long)(L->base_ci).top.p + lVar24);
        if ((pGVar20 != (GCObject *)0x0) && ((pGVar20->marked & 0x18) != 0)) {
          reallymarkobject(g,pGVar20);
          iVar18 = *(int *)((long)&L->ci + 4);
        }
        lVar22 = lVar22 + 1;
        lVar24 = lVar24 + 0x10;
      } while (lVar22 < iVar18);
      iVar19 = *(int *)&L->ci;
    }
    lVar13 = (lu_mem)(iVar19 + iVar18 + *(int *)((long)&L->top + 4) + *(int *)&L->top + 1);
    break;
  default:
    if (L->tt != '&') {
      return 0;
    }
    bVar7 = L->status;
    if (bVar7 == 0) goto LAB_0010d67c;
    pSVar25 = &L->stack_last;
    uVar21 = 0;
    do {
      if ((((ulong)*pSVar25 & 0x40) != 0) &&
         (((((CallInfo *)pSVar25[-1].p)->top).offset & 0x1800U) != 0)) {
        reallymarkobject(g,(GCObject *)pSVar25[-1].p);
        bVar7 = L->status;
      }
      uVar21 = uVar21 + 1;
      uVar12 = (ulong)bVar7;
      pSVar25 = pSVar25 + 2;
    } while (uVar21 < uVar12);
LAB_0010d617:
    lVar13 = uVar12 + 1;
  }
  return lVar13;
}

Assistant:

static lu_mem propagatemark (global_State *g) {
  GCObject *o = g->gray;
  nw2black(o);
  g->gray = *getgclist(o);  /* remove from 'gray' list */
  switch (o->tt) {
    case LUA_VTABLE: return traversetable(g, gco2t(o));
    case LUA_VUSERDATA: return traverseudata(g, gco2u(o));
    case LUA_VLCL: return traverseLclosure(g, gco2lcl(o));
    case LUA_VCCL: return traverseCclosure(g, gco2ccl(o));
    case LUA_VPROTO: return traverseproto(g, gco2p(o));
    case LUA_VTHREAD: return traversethread(g, gco2th(o));
    default: lua_assert(0); return 0;
  }
}